

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::doPendingFunctors(EventLoop *this)

{
  function<void_()> *pfVar1;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *in_RDI;
  size_t i;
  MutexLockGuard lock;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> functors;
  MutexLock *in_stack_ffffffffffffffa8;
  MutexLockGuard *in_stack_ffffffffffffffb0;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
  *in_stack_ffffffffffffffc0;
  function<void_()> *this_00;
  function<void_()> *this_01;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_20;
  
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)0x10967d);
  *(undefined1 *)
   &in_RDI[4].super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
    _M_impl.super__Vector_impl_data._M_start = 1;
  MutexLockGuard::MutexLockGuard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::swap
            (in_stack_ffffffffffffffc0,in_RDI);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x1096b3);
  this_00 = (function<void_()> *)0x0;
  while( true ) {
    this_01 = this_00;
    pfVar1 = (function<void_()> *)
             std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                       (&local_20);
    if (pfVar1 <= this_00) break;
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::operator[]
              (&local_20,(size_type)this_01);
    std::function<void_()>::operator()(this_00);
    this_00 = (function<void_()> *)((long)&(this_01->super__Function_base)._M_functor + 1);
  }
  *(undefined1 *)
   &in_RDI[4].super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
    _M_impl.super__Vector_impl_data._M_start = 0;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)this_01);
  return;
}

Assistant:

void EventLoop::doPendingFunctors(){
    std::vector<Functor> functors;
    callingPendingFunctors_ = true;

    {
        MutexLockGuard lock(mutex_);
        functors.swap(pendingFunctors_);
    }

    for (size_t i = 0; i < functors.size(); i++)
    {
        functors[i]();
    }
    callingPendingFunctors_ = false;
}